

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O0

_Bool ssh1_handle_direction_specific_packet(ssh1_connection_state *s,PktIn *pktin)

{
  Ssh *ssh;
  LogContext *pLVar1;
  _Bool _Var2;
  unsigned_long uVar3;
  PktOut *pPVar4;
  ssh1_channel *psVar5;
  Channel *pCVar6;
  Socket *s_00;
  char *pcVar7;
  void *pvVar8;
  char *event;
  size_t sVar9;
  ptrlen pVar10;
  int exitcode;
  int bufsize;
  void *local_e0;
  char *err;
  size_t local_c8;
  Socket *skt;
  Channel *ch;
  Plug *plug;
  void *pvStack_a0;
  int port;
  ptrlen data;
  ptrlen host;
  ssh_rportfwd *pfp;
  ssh_rportfwd pf;
  uint remid;
  ssh1_channel *c;
  PktOut *pktout;
  PacketProtocolLayer *ppl;
  PktIn *pktin_local;
  ssh1_connection_state *s_local;
  
  switch(pktin->type) {
  case 0xe:
  case 0xf:
    if (s->succfail_head == (outstanding_succfail *)0x0) {
      ssh = (s->ppl).ssh;
      pcVar7 = ssh1_pkt_type(pktin->type);
      ssh_remote_error(ssh,"Received %s with no outstanding request",pcVar7);
      s_local._7_1_ = true;
    }
    else {
      ssh1_connection_process_succfail(s,pktin->type == 0xe);
      queue_toplevel_callback(ssh1_connection_process_trivial_succfails,s);
      s_local._7_1_ = true;
    }
    break;
  default:
    s_local._7_1_ = false;
    break;
  case 0x11:
  case 0x12:
    pVar10 = BinarySource_get_string(pktin->binarysource_);
    _exitcode = pVar10.ptr;
    pvStack_a0 = _exitcode;
    local_e0 = (void *)pVar10.len;
    data.ptr = local_e0;
    if (pktin->binarysource_[0].err == BSE_NO_ERROR) {
      sVar9 = seat_output((s->ppl).seat,(uint)(pktin->type == 0x12),_exitcode,(size_t)local_e0);
      if (((s->stdout_throttling & 1U) == 0) && (0x8000 < (int)sVar9)) {
        s->stdout_throttling = true;
        ssh_throttle_conn((s->ppl).ssh,1);
      }
    }
    s_local._7_1_ = true;
    break;
  case 0x14:
    uVar3 = BinarySource_get_uint32(pktin->binarysource_);
    pLVar1 = (s->ppl).logctx;
    pcVar7 = dupprintf("Server sent command exit status %d",uVar3 & 0xffffffff);
    logevent_and_free(pLVar1,pcVar7);
    ssh_got_exitcode((s->ppl).ssh,(int)uVar3);
    s->session_terminated = true;
    s_local._7_1_ = true;
    break;
  case 0x1b:
    uVar3 = BinarySource_get_uint32(pktin->binarysource_);
    pf.pfr._4_4_ = (uint)uVar3;
    if ((s->X11_fwd_enabled & 1U) == 0) {
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0x16);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)pf.pfr._4_4_);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
      pLVar1 = (s->ppl).logctx;
      pcVar7 = dupprintf("Rejected X11 connect request");
      logevent_and_free(pLVar1,pcVar7);
    }
    else {
      psVar5 = (ssh1_channel *)safemalloc(1,0x38,0);
      psVar5->connlayer = s;
      ssh1_channel_init(psVar5);
      psVar5->remoteid = pf.pfr._4_4_;
      pCVar6 = x11_new_channel(s->x11authtree,&psVar5->sc,(char *)0x0,-1,false);
      psVar5->chan = pCVar6;
      psVar5->remoteid = pf.pfr._4_4_;
      psVar5->halfopen = false;
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0x15);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)psVar5->remoteid);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)psVar5->localid);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
      pLVar1 = (s->ppl).logctx;
      pcVar7 = dupprintf("Opened X11 forward channel");
      logevent_and_free(pLVar1,pcVar7);
    }
    s_local._7_1_ = true;
    break;
  case 0x1d:
    uVar3 = BinarySource_get_uint32(pktin->binarysource_);
    pf.pfr._4_4_ = (uint)uVar3;
    pVar10 = BinarySource_get_string(pktin->binarysource_);
    err = (char *)pVar10.ptr;
    data.len = (size_t)err;
    local_c8 = pVar10.len;
    uVar3 = BinarySource_get_uint32(pktin->binarysource_);
    plug._4_4_ = toint((uint)uVar3);
    pVar10.len = local_c8;
    pVar10.ptr = (void *)data.len;
    pf.shost = mkstr(pVar10);
    pfp._4_4_ = plug._4_4_;
    pvVar8 = find234(s->rportfwds,&pfp,(cmpfn234)0x0);
    if (pvVar8 == (void *)0x0) {
      pLVar1 = (s->ppl).logctx;
      pcVar7 = dupprintf("Rejected remote port open request for %s:%d",pf.shost,(ulong)plug._4_4_);
      logevent_and_free(pLVar1,pcVar7);
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0x16);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)pf.pfr._4_4_);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
    }
    else {
      psVar5 = (ssh1_channel *)safemalloc(1,0x38,0);
      psVar5->connlayer = s;
      pLVar1 = (s->ppl).logctx;
      pcVar7 = dupprintf("Received remote port open request for %s:%d",pf.shost,(ulong)plug._4_4_);
      logevent_and_free(pLVar1,pcVar7);
      pcVar7 = portfwdmgr_connect(s->portfwdmgr,&psVar5->chan,pf.shost,plug._4_4_,&psVar5->sc,
                                  *(int *)((long)pvVar8 + 0x18));
      if (pcVar7 == (char *)0x0) {
        ssh1_channel_init(psVar5);
        psVar5->remoteid = pf.pfr._4_4_;
        psVar5->halfopen = false;
        pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0x15);
        BinarySink_put_uint32(pPVar4->binarysink_,(ulong)psVar5->remoteid);
        BinarySink_put_uint32(pPVar4->binarysink_,(ulong)psVar5->localid);
        pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
        pLVar1 = (s->ppl).logctx;
        pcVar7 = dupprintf("Forwarded port opened successfully");
        logevent_and_free(pLVar1,pcVar7);
      }
      else {
        pLVar1 = (s->ppl).logctx;
        event = dupprintf("Port open failed: %s",pcVar7);
        logevent_and_free(pLVar1,event);
        safefree(pcVar7);
        ssh1_channel_free(psVar5);
        pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0x16);
        BinarySink_put_uint32(pPVar4->binarysink_,(ulong)pf.pfr._4_4_);
        pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
      }
    }
    safefree(pf.shost);
    s_local._7_1_ = true;
    break;
  case 0x1f:
    uVar3 = BinarySource_get_uint32(pktin->binarysource_);
    pf.pfr._4_4_ = (uint)uVar3;
    _Var2 = ssh_agent_forwarding_permitted(&s->cl);
    if (_Var2) {
      psVar5 = (ssh1_channel *)safemalloc(1,0x38,0);
      psVar5->connlayer = s;
      ssh1_channel_init(psVar5);
      psVar5->remoteid = pf.pfr._4_4_;
      psVar5->halfopen = false;
      pCVar6 = portfwd_raw_new(&s->cl,(Plug **)&ch,true);
      s_00 = agent_connect((Plug *)ch);
      pcVar7 = sk_socket_error(s_00);
      if (pcVar7 == (char *)0x0) {
        portfwd_raw_setup(pCVar6,s_00,&psVar5->sc);
        psVar5->chan = pCVar6;
      }
      else {
        portfwd_raw_free(pCVar6);
        pCVar6 = agentf_new(&psVar5->sc);
        psVar5->chan = pCVar6;
      }
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0x15);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)psVar5->remoteid);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)psVar5->localid);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
    }
    else {
      pPVar4 = ssh_bpp_new_pktout((s->ppl).bpp,0x16);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)pf.pfr._4_4_);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar4->qnode);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

bool ssh1_handle_direction_specific_packet(
    struct ssh1_connection_state *s, PktIn *pktin)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */

    PktOut *pktout;
    struct ssh1_channel *c;
    unsigned remid;
    struct ssh_rportfwd pf, *pfp;
    ptrlen host, data;
    int port;

    switch (pktin->type) {
      case SSH1_SMSG_SUCCESS:
      case SSH1_SMSG_FAILURE:
        if (!s->succfail_head) {
            ssh_remote_error(s->ppl.ssh,
                             "Received %s with no outstanding request",
                             ssh1_pkt_type(pktin->type));
            return true;
        }

        ssh1_connection_process_succfail(
            s, pktin->type == SSH1_SMSG_SUCCESS);
        queue_toplevel_callback(
            ssh1_connection_process_trivial_succfails, s);

        return true;

      case SSH1_SMSG_X11_OPEN:
        remid = get_uint32(pktin);

        /* Refuse if X11 forwarding is disabled. */
        if (!s->X11_fwd_enabled) {
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_FAILURE);
            put_uint32(pktout, remid);
            pq_push(s->ppl.out_pq, pktout);
            ppl_logevent("Rejected X11 connect request");
        } else {
            c = snew(struct ssh1_channel);
            c->connlayer = s;
            ssh1_channel_init(c);
            c->remoteid = remid;
            c->chan = x11_new_channel(s->x11authtree, &c->sc,
                                      NULL, -1, false);
            c->remoteid = remid;
            c->halfopen = false;

            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_CONFIRMATION);
            put_uint32(pktout, c->remoteid);
            put_uint32(pktout, c->localid);
            pq_push(s->ppl.out_pq, pktout);
            ppl_logevent("Opened X11 forward channel");
        }

        return true;

      case SSH1_SMSG_AGENT_OPEN:
        remid = get_uint32(pktin);

        /* Refuse if agent forwarding is disabled. */
        if (!ssh_agent_forwarding_permitted(&s->cl)) {
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_FAILURE);
            put_uint32(pktout, remid);
            pq_push(s->ppl.out_pq, pktout);
        } else {
            c = snew(struct ssh1_channel);
            c->connlayer = s;
            ssh1_channel_init(c);
            c->remoteid = remid;
            c->halfopen = false;

            /*
             * If possible, make a stream-oriented connection to the
             * agent and set up an ordinary port-forwarding type
             * channel over it.
             */
            Plug *plug;
            Channel *ch = portfwd_raw_new(&s->cl, &plug, true);
            Socket *skt = agent_connect(plug);
            if (!sk_socket_error(skt)) {
                portfwd_raw_setup(ch, skt, &c->sc);
                c->chan = ch;
            } else {
                portfwd_raw_free(ch);

                /*
                 * Otherwise, fall back to the old-fashioned system of
                 * parsing the forwarded data stream ourselves for
                 * message boundaries, and passing each individual
                 * message to the one-off agent_query().
                 */
                c->chan = agentf_new(&c->sc);
            }

            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_CONFIRMATION);
            put_uint32(pktout, c->remoteid);
            put_uint32(pktout, c->localid);
            pq_push(s->ppl.out_pq, pktout);
        }

        return true;

      case SSH1_MSG_PORT_OPEN:
        remid = get_uint32(pktin);
        host = get_string(pktin);
        port = toint(get_uint32(pktin));

        pf.dhost = mkstr(host);
        pf.dport = port;
        pfp = find234(s->rportfwds, &pf, NULL);

        if (!pfp) {
            ppl_logevent("Rejected remote port open request for %s:%d",
                         pf.dhost, port);
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_FAILURE);
            put_uint32(pktout, remid);
            pq_push(s->ppl.out_pq, pktout);
        } else {
            char *err;

            c = snew(struct ssh1_channel);
            c->connlayer = s;
            ppl_logevent("Received remote port open request for %s:%d",
                         pf.dhost, port);
            err = portfwdmgr_connect(
                s->portfwdmgr, &c->chan, pf.dhost, port,
                &c->sc, pfp->addressfamily);

            if (err) {
                ppl_logevent("Port open failed: %s", err);
                sfree(err);
                ssh1_channel_free(c);
                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_FAILURE);
                put_uint32(pktout, remid);
                pq_push(s->ppl.out_pq, pktout);
            } else {
                ssh1_channel_init(c);
                c->remoteid = remid;
                c->halfopen = false;
                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_CONFIRMATION);
                put_uint32(pktout, c->remoteid);
                put_uint32(pktout, c->localid);
                pq_push(s->ppl.out_pq, pktout);
                ppl_logevent("Forwarded port opened successfully");
            }
        }

        sfree(pf.dhost);

        return true;

      case SSH1_SMSG_STDOUT_DATA:
      case SSH1_SMSG_STDERR_DATA:
        data = get_string(pktin);
        if (!get_err(pktin)) {
            int bufsize = seat_output(
                s->ppl.seat, pktin->type == SSH1_SMSG_STDERR_DATA,
                data.ptr, data.len);
            if (!s->stdout_throttling && bufsize > SSH1_BUFFER_LIMIT) {
                s->stdout_throttling = true;
                ssh_throttle_conn(s->ppl.ssh, +1);
            }
        }

        return true;

      case SSH1_SMSG_EXIT_STATUS: {
        int exitcode = get_uint32(pktin);
        ppl_logevent("Server sent command exit status %d", exitcode);
        ssh_got_exitcode(s->ppl.ssh, exitcode);

        s->session_terminated = true;
        return true;
      }

      default:
        return false;
    }
}